

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O0

Amount cfd::core::ConfidentialValue::ConvertFromConfidentialValue(ByteData *value)

{
  CfdException *this;
  size_type value_len;
  undefined8 uVar1;
  undefined8 extraout_RDX;
  Amount AVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff30;
  string *message;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  CfdError error_code;
  undefined1 local_99 [33];
  CfdSourceLocation local_78;
  int local_4c;
  uint64_t uStack_48;
  int ret;
  uint64_t satoshi;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer;
  ByteData *value_local;
  undefined1 local_10;
  
  this_00 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&satoshi;
  buffer = &value->data_;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,value);
  uStack_48 = 0;
  local_28 = this_00;
  this = (CfdException *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(this_00)
  ;
  error_code = (CfdError)((ulong)this_00 >> 0x20);
  value_len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_28);
  local_4c = wally_tx_confidential_value_to_satoshi
                       ((uchar *)this,value_len,&stack0xffffffffffffffb8);
  if (local_4c != 0) {
    local_78.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_elements_transaction.cpp"
                 ,0x2f);
    local_78.filename = local_78.filename + 1;
    local_78.line = 0x297;
    local_78.funcname = "ConvertFromConfidentialValue";
    logger::warn<int&>(&local_78,"wally_tx_confidential_value_to_satoshi NG[{}].",&local_4c);
    uVar1 = __cxa_allocate_exception(0x30);
    message = (string *)local_99;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)(local_99 + 1),"convert from confidential value error.",
               (allocator *)message);
    CfdException::CfdException(this,error_code,message);
    __cxa_throw(uVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  AVar2 = Amount::CreateBySatoshiAmount(uStack_48);
  value_local = (ByteData *)AVar2.amount_;
  local_10 = AVar2.ignore_check_;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_ffffffffffffff30);
  AVar2._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  AVar2.ignore_check_ = (bool)local_10;
  AVar2.amount_ = (int64_t)value_local;
  return AVar2;
}

Assistant:

Amount ConfidentialValue::ConvertFromConfidentialValue(  // force LF
    const ByteData &value) {
  const std::vector<uint8_t> &buffer = value.GetBytes();
  uint64_t satoshi = 0;
  int ret = wally_tx_confidential_value_to_satoshi(
      buffer.data(), buffer.size(), &satoshi);
  if (ret != WALLY_OK) {
    warn(
        CFD_LOG_SOURCE, "wally_tx_confidential_value_to_satoshi NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "convert from confidential value error.");
  }
  return Amount::CreateBySatoshiAmount(static_cast<int64_t>(satoshi));
}